

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O0

void __thiscall
RuntimeInterface::ForgetDebugMessenger(RuntimeInterface *this,XrDebugUtilsMessengerEXT messenger)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> mlock;
  XrDebugUtilsMessengerEXT messenger_local;
  RuntimeInterface *this_local;
  
  if (messenger != (XrDebugUtilsMessengerEXT)0x0) {
    mlock._M_device = (mutex_type *)messenger;
    std::lock_guard<std::mutex>::lock_guard(&local_20,&this->_messenger_to_instance_mutex);
    std::
    unordered_map<XrDebugUtilsMessengerEXT_T_*,_XrInstance_T_*,_std::hash<XrDebugUtilsMessengerEXT_T_*>,_std::equal_to<XrDebugUtilsMessengerEXT_T_*>,_std::allocator<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>_>_>
    ::erase(&this->_messenger_to_instance_map,(key_type *)&mlock);
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
  }
  return;
}

Assistant:

void RuntimeInterface::ForgetDebugMessenger(XrDebugUtilsMessengerEXT messenger) {
    if (XR_NULL_HANDLE != messenger) {
        std::lock_guard<std::mutex> mlock(_messenger_to_instance_mutex);
        _messenger_to_instance_map.erase(messenger);
    }
}